

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmacsha256.c
# Opt level: O2

HMACSHA256_RESULT
HMACSHA256_ComputeHash(uchar *key,size_t keyLen,uchar *payload,size_t payloadLen,BUFFER_HANDLE hash)

{
  int iVar1;
  HMACSHA256_RESULT HVar2;
  uchar *digest;
  
  if (hash == (BUFFER_HANDLE)0x0 ||
      ((payloadLen == 0 || payload == (uchar *)0x0) || (keyLen == 0 || key == (uchar *)0x0))) {
    HVar2 = HMACSHA256_INVALID_ARG;
  }
  else {
    iVar1 = BUFFER_enlarge(hash,0x20);
    if (iVar1 == 0) {
      digest = BUFFER_u_char(hash);
      iVar1 = hmac(SHA256,payload,(int)payloadLen,key,(int)keyLen,digest);
      HVar2 = (uint)(iVar1 != 0) * 2 + HMACSHA256_OK;
    }
    else {
      HVar2 = HMACSHA256_ERROR;
    }
  }
  return HVar2;
}

Assistant:

HMACSHA256_RESULT HMACSHA256_ComputeHash(const unsigned char* key, size_t keyLen, const unsigned char* payload, size_t payloadLen, BUFFER_HANDLE hash)
{
    HMACSHA256_RESULT result;

    if (key == NULL ||
        keyLen == 0 ||
        payload == NULL ||
        payloadLen == 0 ||
        hash == NULL)
    {
        result = HMACSHA256_INVALID_ARG;
    }
    else
    {
        if ((BUFFER_enlarge(hash, 32) != 0) ||
            (hmac(SHA256, payload, (int)payloadLen, key, (int)keyLen, BUFFER_u_char(hash) ) != 0))
        {
            result = HMACSHA256_ERROR;
        }
        else
        {
            result = HMACSHA256_OK;
        }
    }

    return result;
}